

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O3

void jpgd::jpeg_decoder::decode_block_ac_refine
               (jpeg_decoder *pD,int component_id,int block_x,int block_y)

{
  byte bVar1;
  short sVar2;
  coeff_buf *pcVar3;
  uint8 *puVar4;
  huff_tables *phVar5;
  bool bVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  uint local_3c;
  
  bVar1 = (byte)pD->m_successive_low;
  uVar10 = 1 << (bVar1 & 0x1f);
  uVar13 = -1 << (bVar1 & 0x1f);
  pcVar3 = pD->m_ac_coeffs[component_id];
  if ((pcVar3->block_num_x <= block_x) || (pcVar3->block_num_y <= block_y)) {
    __assert_fail("(block_x < cb->block_num_x) && (block_y < cb->block_num_y)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]usbcam/jpgd.cpp"
                  ,0xa21,"jpgd_block_t *jpgd::jpeg_decoder::coeff_buf_getp(coeff_buf *, int, int)");
  }
  if (0x3f < pD->m_spectral_end) {
    __assert_fail("pD->m_spectral_end <= 63",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]usbcam/jpgd.cpp"
                  ,0xa7b,
                  "static void jpgd::jpeg_decoder::decode_block_ac_refine(jpeg_decoder *, int, int, int)"
                 );
  }
  puVar4 = pcVar3->pData;
  lVar7 = (long)(pcVar3->block_num_x * block_y * pcVar3->block_size) +
          (long)(block_x * pcVar3->block_size);
  uVar14 = pD->m_spectral_start;
  iVar9 = pD->m_eob_run;
  if (iVar9 == 0) {
    if (pD->m_spectral_end < (int)uVar14) {
      return;
    }
    do {
      phVar5 = pD->m_pHuff_tabs[pD->m_comp_ac_tab[component_id]];
      uVar15 = (ulong)(int)phVar5->look_up[pD->m_bit_buf >> 0x18];
      if ((long)uVar15 < 0) {
        uVar12 = 0xfffffff8;
        do {
          uVar12 = uVar12 - 1;
          iVar9 = (int)uVar15;
          uVar15 = (ulong)phVar5->tree[-(uint)((pD->m_bit_buf >> (uVar12 & 0x1f) & 1) != 0) - iVar9]
          ;
        } while ((int)phVar5->tree[-(uint)((pD->m_bit_buf >> (uVar12 & 0x1f) & 1) != 0) - iVar9] < 0
                );
        uVar12 = -uVar12;
      }
      else {
        uVar12 = (uint)phVar5->code_size[uVar15];
      }
      get_bits_no_markers(pD,uVar12);
      uVar11 = uVar15 >> 4 & 0xfffffff;
      if ((uVar15 & 0xf) == 0) {
        local_3c = 0;
        if ((int)uVar11 != 0xf) {
          iVar9 = 1 << ((byte)uVar11 & 0x1f);
          pD->m_eob_run = iVar9;
          if (0xf < (uint)uVar15) {
            uVar8 = get_bits_no_markers(pD,(int)uVar11);
            iVar9 = uVar8 + pD->m_eob_run;
            pD->m_eob_run = iVar9;
          }
          goto LAB_0010ae54;
        }
      }
      else {
        if (((uint)uVar15 & 0xf) != 1) {
          stop_decoding(pD,JPGD_DECODE_ERROR);
        }
        uVar8 = get_bits_no_markers(pD,1);
        local_3c = uVar10;
        if (uVar8 == 0) {
          local_3c = uVar13;
        }
      }
      do {
        lVar16 = (long)(int)(&g_ZAG)[uVar14 & 0x3f];
        if (*(short *)(puVar4 + lVar16 * 2 + lVar7) == 0) {
          uVar12 = uVar14;
          if ((int)uVar11 < 1) break;
          uVar11 = (ulong)((int)uVar11 - 1);
        }
        else {
          uVar8 = get_bits_no_markers(pD,1);
          if ((uVar8 != 0) &&
             (sVar2 = *(short *)(puVar4 + lVar16 * 2 + lVar7), (uVar10 & (int)sVar2) == 0)) {
            uVar12 = uVar10;
            if (sVar2 < 0) {
              uVar12 = uVar13;
            }
            *(short *)(puVar4 + lVar16 * 2 + lVar7) = (short)uVar12 + sVar2;
          }
        }
        uVar12 = uVar14 + 1;
        bVar6 = (int)uVar14 < pD->m_spectral_end;
        uVar14 = uVar12;
      } while (bVar6);
      if ((local_3c != 0) && ((int)uVar12 < 0x40)) {
        *(short *)(puVar4 + (long)(int)(&g_ZAG)[(int)uVar12] * 2 + lVar7) = (short)local_3c;
      }
      uVar14 = uVar12 + 1;
    } while ((int)uVar12 < pD->m_spectral_end);
    iVar9 = pD->m_eob_run;
  }
LAB_0010ae54:
  if (0 < iVar9) {
    if ((int)uVar14 <= pD->m_spectral_end) {
      do {
        lVar16 = (long)(int)(&g_ZAG)[uVar14 & 0x3f];
        if (((*(short *)(puVar4 + lVar16 * 2 + lVar7) != 0) &&
            (uVar8 = get_bits_no_markers(pD,1), uVar8 != 0)) &&
           (sVar2 = *(short *)(puVar4 + lVar16 * 2 + lVar7), (uVar10 & (int)sVar2) == 0)) {
          uVar12 = uVar10;
          if (sVar2 < 0) {
            uVar12 = uVar13;
          }
          *(short *)(puVar4 + lVar16 * 2 + lVar7) = (short)uVar12 + sVar2;
        }
        bVar6 = (int)uVar14 < pD->m_spectral_end;
        uVar14 = uVar14 + 1;
      } while (bVar6);
      iVar9 = pD->m_eob_run;
    }
    pD->m_eob_run = iVar9 + -1;
  }
  return;
}

Assistant:

void jpeg_decoder::decode_block_ac_refine(jpeg_decoder *pD, int component_id, int block_x, int block_y)
{
  int s, k, r;
  int p1 = 1 << pD->m_successive_low;
  int m1 = (-1) << pD->m_successive_low;
  jpgd_block_t *p = pD->coeff_buf_getp(pD->m_ac_coeffs[component_id], block_x, block_y);
  
  JPGD_ASSERT(pD->m_spectral_end <= 63);
  
  k = pD->m_spectral_start;
  
  if (pD->m_eob_run == 0)
  {
    for ( ; k <= pD->m_spectral_end; k++)
    {
      s = pD->huff_decode(pD->m_pHuff_tabs[pD->m_comp_ac_tab[component_id]]);

      r = s >> 4;
      s &= 15;

      if (s)
      {
        if (s != 1)
          pD->stop_decoding(JPGD_DECODE_ERROR);

        if (pD->get_bits_no_markers(1))
          s = p1;
        else
          s = m1;
      }
      else
      {
        if (r != 15)
        {
          pD->m_eob_run = 1 << r;

          if (r)
            pD->m_eob_run += pD->get_bits_no_markers(r);

          break;
        }
      }

      do
      {
        jpgd_block_t *this_coef = p + g_ZAG[k & 63];

        if (*this_coef != 0)
        {
          if (pD->get_bits_no_markers(1))
          {
            if ((*this_coef & p1) == 0)
            {
              if (*this_coef >= 0)
                *this_coef = static_cast<jpgd_block_t>(*this_coef + p1);
              else
                *this_coef = static_cast<jpgd_block_t>(*this_coef + m1);
            }
          }
        }
        else
        {
          if (--r < 0)
            break;
        }

        k++;

      } while (k <= pD->m_spectral_end);

      if ((s) && (k < 64))
      {
        p[g_ZAG[k]] = static_cast<jpgd_block_t>(s);
      }
    }
  }

  if (pD->m_eob_run > 0)
  {
    for ( ; k <= pD->m_spectral_end; k++)
    {
      jpgd_block_t *this_coef = p + g_ZAG[k & 63]; // logical AND to shut up static code analysis

      if (*this_coef != 0)
      {
        if (pD->get_bits_no_markers(1))
        {
          if ((*this_coef & p1) == 0)
          {
            if (*this_coef >= 0)
              *this_coef = static_cast<jpgd_block_t>(*this_coef + p1);
            else
              *this_coef = static_cast<jpgd_block_t>(*this_coef + m1);
          }
        }
      }
    }

    pD->m_eob_run--;
  }
}